

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

int yaml_queue_extend(void **start,void **head,void **tail,void **end)

{
  void *ptr;
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  
  ptr = *start;
  pvVar3 = *tail;
  pvVar1 = *end;
  if (pvVar3 == pvVar1 && *head == ptr) {
    ptr = yaml_realloc(ptr,((long)pvVar3 - (long)ptr) * 2);
    if (ptr == (void *)0x0) {
      return 0;
    }
    *head = (void *)(((long)*head - (long)*start) + (long)ptr);
    *tail = (void *)(((long)*tail - (long)*start) + (long)ptr);
    *end = (void *)((long)ptr + ((long)*end - (long)*start) * 2);
    *start = ptr;
    pvVar3 = *tail;
    pvVar1 = *end;
  }
  if (pvVar3 == pvVar1) {
    pvVar3 = *head;
    pvVar2 = pvVar1;
    if (pvVar3 != pvVar1) {
      memmove(ptr,pvVar3,(long)pvVar1 - (long)pvVar3);
      pvVar1 = *tail;
      ptr = *start;
      pvVar2 = *head;
    }
    *tail = (void *)(((long)pvVar1 - (long)pvVar2) + (long)ptr);
    *head = *start;
  }
  return 1;
}

Assistant:

YAML_DECLARE(int)
yaml_queue_extend(void **start, void **head, void **tail, void **end)
{
    /* Check if we need to resize the queue. */

    if (*start == *head && *tail == *end) {
        void *new_start = yaml_realloc(*start,
                ((char *)*end - (char *)*start)*2);

        if (!new_start) return 0;

        *head = (char *)new_start + ((char *)*head - (char *)*start);
        *tail = (char *)new_start + ((char *)*tail - (char *)*start);
        *end = (char *)new_start + ((char *)*end - (char *)*start)*2;
        *start = new_start;
    }

    /* Check if we need to move the queue at the beginning of the buffer. */

    if (*tail == *end) {
        if (*head != *tail) {
            memmove(*start, *head, (char *)*tail - (char *)*head);
        }
        *tail = (char *)*tail - (char *)*head + (char *)*start;
        *head = *start;
    }

    return 1;
}